

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

MixMaterial *
pbrt::MixMaterial::Create
          (MaterialHandle *materials,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  initializer_list<pbrt::SpectrumTextureHandle> stex;
  bool bVar1;
  MixMaterial *pMVar2;
  BasicTextureEvaluator *in_RCX;
  FloatTextureHandle *in_RSI;
  FloatTextureHandle amount;
  FileLoc *loc_00;
  iterator in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  Float in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  TextureParameterDictionary *in_stack_ffffffffffffff80;
  Allocator in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  initializer_list<pbrt::FloatTextureHandle> in_stack_ffffffffffffffb0;
  
  loc_00 = (FileLoc *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  TextureParameterDictionary::GetFloatTexture
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  if ((*(byte *)(Options + 0xf) & 1) != 0) {
    bVar1 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            ::Is<pbrt::MixMaterial>
                      ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                        *)loc_00);
    if ((bVar1) ||
       (bVar1 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                ::Is<pbrt::MixMaterial>
                          ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                            *)loc_00), bVar1)) {
      ErrorExit(loc_00,(char *)in_RSI);
    }
    FloatTextureHandle::FloatTextureHandle((FloatTextureHandle *)loc_00,in_RSI);
    std::initializer_list<pbrt::SpectrumTextureHandle>::initializer_list
              ((initializer_list<pbrt::SpectrumTextureHandle> *)&stack0xffffffffffffff68);
    stex._M_len = in_stack_ffffffffffffffa8;
    stex._M_array = (iterator)in_stack_ffffffffffffffa0;
    bVar1 = BasicTextureEvaluator::CanEvaluate(in_RCX,in_stack_ffffffffffffffb0,stex);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ErrorExit(loc_00,(char *)in_RSI);
    }
  }
  pMVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::MixMaterial,pbrt::MaterialHandle*&,pbrt::FloatTextureHandle&>
                     ((polymorphic_allocator<std::byte> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (MaterialHandle **)in_stack_ffffffffffffff68,(FloatTextureHandle *)loc_00);
  return pMVar2;
}

Assistant:

MixMaterial *MixMaterial::Create(MaterialHandle materials[2],
                                 const TextureParameterDictionary &parameters,
                                 const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle amount = parameters.GetFloatTexture("amount", 0.5f, alloc);

    if (Options->useGPU) {
        // Check for this stuff here, where we can include the FileLoc in
        // the error message. Note that both of these limitations could be
        // relaxed if they were problematic; the issue is that we currently
        // resolve MixMaterials in the closest hit shader, where we'd like
        // to, for example, not introduce the complexity of potentially
        // recursively evaluating textures, etc.
        if (materials[0].Is<MixMaterial>() || materials[1].Is<MixMaterial>())
            ErrorExit(loc, "The GPU renderer doesn't currently support using "
                           "\"mix\" materials as parameters to the \"mix\" material.");
        if (!BasicTextureEvaluator().CanEvaluate({amount}, {}))
            ErrorExit(loc, "The GPU renderer currently only supports basic textures "
                           "for its \"amount\" parameter.");
    }

    return alloc.new_object<MixMaterial>(materials, amount);
}